

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# controller.cpp
# Opt level: O0

void Controller::click::InternalClicker::clicker
               (int given_x,int given_y,bool autodiscover,Minefield *mfield,bool only_autodiscover,
               bool called_during_autodiscover)

{
  bool bVar1;
  int iVar2;
  const_iterator piVar3;
  int dy_1;
  const_iterator __end8;
  const_iterator __begin8;
  undefined4 local_108;
  undefined4 local_104;
  initializer_list<int> local_100;
  initializer_list<int> *local_f0;
  initializer_list<int> *__range8;
  const_iterator piStack_e0;
  int dx_1;
  const_iterator __end7_1;
  const_iterator __begin7_1;
  undefined4 local_c8;
  undefined4 local_c4;
  initializer_list<int> local_c0;
  initializer_list<int> *local_b0;
  initializer_list<int> *__range7_1;
  const_iterator piStack_a0;
  int dy;
  const_iterator __end7;
  const_iterator __begin7;
  undefined4 local_88;
  undefined4 local_84;
  initializer_list<int> local_80;
  initializer_list<int> *local_70;
  initializer_list<int> *__range7;
  const_iterator piStack_60;
  int dx;
  const_iterator __end6;
  const_iterator __begin6;
  undefined4 local_48;
  undefined4 local_44;
  initializer_list<int> local_40;
  initializer_list<int> *local_30;
  initializer_list<int> *__range6;
  int flag_count;
  bool called_during_autodiscover_local;
  bool only_autodiscover_local;
  Minefield *mfield_local;
  int local_10;
  uint uStack_c;
  bool autodiscover_local;
  int given_y_local;
  int given_x_local;
  
  __range6._6_1_ = called_during_autodiscover;
  __range6._7_1_ = only_autodiscover;
  _flag_count = mfield;
  mfield_local._7_1_ = autodiscover;
  local_10 = given_y;
  uStack_c = given_x;
  bVar1 = Minefield::isPosValid(mfield,given_x,given_y);
  if (((bVar1) && (bVar1 = Minefield::isGameRunning(_flag_count), bVar1)) &&
     (bVar1 = Minefield::isFlagged(_flag_count,uStack_c,local_10), !bVar1)) {
    if (((mfield_local._7_1_ & 1) == 0) ||
       (bVar1 = Minefield::isOpen(_flag_count,uStack_c,local_10), !bVar1)) {
      if (((__range6._6_1_ & 1) != 0) ||
         ((iVar2 = Minefield::getOpenCount(_flag_count), iVar2 == 0 || ((__range6._7_1_ & 1) == 0)))
         ) {
        Minefield::open(_flag_count,(char *)(ulong)uStack_c,local_10,1);
      }
    }
    else {
      __range6._0_4_ = 0;
      __begin6._4_4_ = 0xffffffff;
      local_48 = 0;
      local_44 = 1;
      local_40._M_array = (iterator)((long)&__begin6 + 4);
      local_40._M_len = 3;
      local_30 = &local_40;
      __end6 = std::initializer_list<int>::begin(local_30);
      piStack_60 = std::initializer_list<int>::end(local_30);
      for (; __end6 != piStack_60; __end6 = __end6 + 1) {
        __range7._4_4_ = *__end6;
        __begin7._4_4_ = 0xffffffff;
        local_88 = 0;
        local_84 = 1;
        local_80._M_array = (iterator)((long)&__begin7 + 4);
        local_80._M_len = 3;
        local_70 = &local_80;
        __end7 = std::initializer_list<int>::begin(local_70);
        piStack_a0 = std::initializer_list<int>::end(local_70);
        for (; __end7 != piStack_a0; __end7 = __end7 + 1) {
          __range7_1._4_4_ = *__end7;
          bVar1 = Minefield::isPosValid
                            (_flag_count,uStack_c + __range7._4_4_,local_10 + __range7_1._4_4_);
          if ((bVar1) &&
             (bVar1 = Minefield::isFlagged
                                (_flag_count,uStack_c + __range7._4_4_,local_10 + __range7_1._4_4_),
             bVar1)) {
            __range6._0_4_ = (int)__range6 + 1;
          }
        }
      }
      if (((int)__range6 != 0) &&
         (iVar2 = Minefield::getSorroundingMineCount(_flag_count,uStack_c,local_10),
         iVar2 == (int)__range6)) {
        __begin7_1._4_4_ = 0xffffffff;
        local_c8 = 0;
        local_c4 = 1;
        local_c0._M_array = (iterator)((long)&__begin7_1 + 4);
        local_c0._M_len = 3;
        local_b0 = &local_c0;
        __end7_1 = std::initializer_list<int>::begin(local_b0);
        piStack_e0 = std::initializer_list<int>::end(local_b0);
        for (; __end7_1 != piStack_e0; __end7_1 = __end7_1 + 1) {
          __range8._4_4_ = *__end7_1;
          __begin8._4_4_ = 0xffffffff;
          local_108 = 0;
          local_104 = 1;
          local_100._M_array = (iterator)((long)&__begin8 + 4);
          local_100._M_len = 3;
          local_f0 = &local_100;
          __end8 = std::initializer_list<int>::begin(local_f0);
          piVar3 = std::initializer_list<int>::end(local_f0);
          for (; __end8 != piVar3; __end8 = __end8 + 1) {
            clicker(uStack_c + __range8._4_4_,local_10 + *__end8,false,_flag_count,
                    (bool)(__range6._7_1_ & 1),true);
          }
        }
      }
    }
  }
  return;
}

Assistant:

static void clicker(int given_x, int given_y, bool autodiscover, Minefield& mfield, bool only_autodiscover, bool called_during_autodiscover = false) {
                // check pos
                if (mfield.isPosValid(given_x, given_y)) {
                    // only do stuff while game is still running
                    if (mfield.isGameRunning()) {
                        // only click on fields w/o flags
                        if(! mfield.isFlagged(given_x, given_y)) {
                            if (autodiscover && mfield.isOpen(given_x, given_y)) {
                                // already open -> autodiscover
                                // if all sorrounding mines are flagged -> open all other sorrounding fields
                                int flag_count = 0;
                                for (int dx : {-1, 0, 1}) {
                                    for (int dy: {-1, 0, 1}) {
                                        if (mfield.isPosValid(given_x + dx, given_y + dy)) {
                                            if (mfield.isFlagged(given_x + dx, given_y + dy)) {
                                                flag_count++;
                                            }
                                        }
                                    }
                                }

                                // don't treat 0 sorrounding mines, because handled by open function
                                if (0 != flag_count && mfield.getSorroundingMineCount(given_x, given_y) == flag_count) {
                                    for (int dx : {-1, 0, 1}) {
                                        for (int dy: {-1, 0, 1}) {
                                            clicker(given_x + dx, given_y + dy, false, mfield, only_autodiscover, true);
                                        }
                                    }
                                }
                            } else {
                                // no autodiscover -> open regularly
                                // unless autodiscover only enable
                                // unless called from autodiscover or no field opened yet
                                if (called_during_autodiscover || 0 == mfield.getOpenCount() || !only_autodiscover) {
                                    mfield.open(given_x, given_y);
                                }
                            }
                        }
                    }
                }
            }